

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumberObject.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptNumberObject::GetDiagValueString
          (JavascriptNumberObject *this,StringBuilder<Memory::ArenaAllocator> *stringBuilder,
          ScriptContext *requestContext)

{
  charcount_t countNeeded;
  ScriptContext *pSVar1;
  char16 *str;
  double value;
  JavascriptString *local_28;
  JavascriptString *valueStr;
  ScriptContext *requestContext_local;
  StringBuilder<Memory::ArenaAllocator> *stringBuilder_local;
  JavascriptNumberObject *this_local;
  
  valueStr = (JavascriptString *)requestContext;
  requestContext_local = (ScriptContext *)stringBuilder;
  stringBuilder_local = (StringBuilder<Memory::ArenaAllocator> *)this;
  EnterPinnedScope(&local_28);
  value = GetValue(this);
  pSVar1 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  local_28 = JavascriptNumber::ToStringRadix10(value,pSVar1);
  pSVar1 = requestContext_local;
  str = JavascriptString::GetString(local_28);
  countNeeded = JavascriptString::GetLength(local_28);
  StringBuilder<Memory::ArenaAllocator>::Append
            ((StringBuilder<Memory::ArenaAllocator> *)pSVar1,str,countNeeded);
  LeavePinnedScope();
  return 1;
}

Assistant:

BOOL JavascriptNumberObject::GetDiagValueString(StringBuilder<ArenaAllocator>* stringBuilder, ScriptContext* requestContext)
    {
        ENTER_PINNED_SCOPE(JavascriptString, valueStr);
        valueStr = JavascriptNumber::ToStringRadix10(this->GetValue(), GetScriptContext());
        stringBuilder->Append(valueStr->GetString(), valueStr->GetLength());
        LEAVE_PINNED_SCOPE();
        return TRUE;
    }